

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace.cc
# Opt level: O0

void xlib::DemangleSymbol(string *symbol)

{
  size_t sVar1;
  int iVar2;
  undefined8 uVar3;
  void *__ptr;
  char *pcVar4;
  int start;
  char *demangled;
  char temp [1024];
  undefined4 local_1c;
  undefined8 uStack_18;
  int status;
  size_t size;
  string *symbol_local;
  
  uStack_18 = 0;
  local_1c = 0xfffffffc;
  size = (size_t)symbol;
  memset(&demangled,0,0x400);
  uVar3 = std::__cxx11::string::c_str();
  iVar2 = __isoc99_sscanf(uVar3,"%*[^(_](%[^ )+]",&demangled);
  if ((iVar2 == 1) &&
     (__ptr = (void *)__cxa_demangle(&demangled,0,&stack0xffffffffffffffe8,&local_1c),
     __ptr != (void *)0x0)) {
    iVar2 = std::__cxx11::string::find((char *)size,(ulong)&demangled);
    sVar1 = size;
    pcVar4 = (char *)strlen((char *)&demangled);
    std::__cxx11::string::replace(sVar1,(long)iVar2,pcVar4);
    std::__cxx11::string::insert(size,(char *)(long)iVar2);
    free(__ptr);
  }
  return;
}

Assistant:

void DemangleSymbol(std::string* symbol) {
    size_t size = 0;
    int status = -4;
    char temp[1024] = {'\0'};
    /*
     * ./px(_ZN11ProxyServer6UpdateEv+0x4c) [0x40d5fa]
     * ./px(_ZN11ProxyServer5ServeEv+0x75) [0x40d853]
     * ./px(main+0x105) [0x40cbf2]
     *  匹配括号中的符号调用cxa_demangle替换
     * ./px(ProxyServer::Update()+0x4c) [0x40d5fa]
     * ./px(ProxyServer::Serve()+0x75) [0x40d853]
     * ./px(main+0x105) [0x40cbf2]
     */
    if (sscanf(symbol->c_str(), "%*[^(_](%[^ )+]", temp) == 1) {
        char* demangled = abi::__cxa_demangle(temp, NULL, &size, &status);
        if (demangled != NULL) {
            int start = symbol->find(temp);
            symbol->replace(start, strlen(temp), "");
            symbol->insert(start, demangled);
            free(demangled);
        }
    }
}